

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O0

string * qpModelStatusToString_abi_cxx11_(QpModelStatus qp_model_status)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Not set",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Undetermined",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Optimal",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Unbounded",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Infeasible",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Iteration limit",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Time ;limit",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Large nullspace",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Unidentified QP model status",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Error",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
  }
  return in_RDI;
}

Assistant:

std::string qpModelStatusToString(const QpModelStatus qp_model_status) {
  switch (qp_model_status) {
    case QpModelStatus::kNotset:
      return "Not set";
    case QpModelStatus::kUndetermined:
      return "Undetermined";
    case QpModelStatus::kOptimal:
      return "Optimal";
    case QpModelStatus::kUnbounded:
      return "Unbounded";
    case QpModelStatus::kInfeasible:
      return "Infeasible";
    case QpModelStatus::kIterationLimit:
      return "Iteration limit";
    case QpModelStatus::kTimeLimit:
      return "Time ;limit";
    case QpModelStatus::kLargeNullspace:
      return "Large nullspace";
    case QpModelStatus::kError:
      return "Error";
    default:
      return "Unidentified QP model status";
  }
}